

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibScl.c
# Opt level: O2

SC_Lib * Abc_SclReadFromGenlib(void *pLib0)

{
  Vec_Wrd_t *p;
  undefined4 uVar1;
  undefined4 uVar2;
  double dVar3;
  int iVar4;
  Mio_PinPhase_t MVar5;
  SC_Lib *p_00;
  char *pcVar6;
  Mio_Gate_t *pGate;
  SC_Cell *Entry;
  Mio_Pin_t *pMVar7;
  SC_Pin *pSVar8;
  word *pwVar9;
  SC_Timings *Entry_00;
  SC_Timing *Entry_01;
  int nCapMin;
  long lVar10;
  
  p_00 = Abc_SclLibAlloc();
  pcVar6 = Mio_LibraryReadName((Mio_Library_t *)pLib0);
  pcVar6 = Abc_UtilStrsav(pcVar6);
  p_00->pName = pcVar6;
  p_00->default_max_out_slew = 0.0;
  p_00->default_wire_load = (char *)0x0;
  p_00->default_wire_load_sel = (char *)0x0;
  p_00->unit_time = 0xc;
  p_00->unit_cap_fst = 1.0;
  p_00->unit_cap_snd = 0xf;
  pGate = Mio_LibraryReadGates((Mio_Library_t *)pLib0);
  do {
    if (pGate == (Mio_Gate_t *)0x0) {
      Abc_SclHashCells(p_00);
      Abc_SclLinkCells(p_00);
      return p_00;
    }
    Entry = Abc_SclCellAlloc();
    Entry->Id = (p_00->vCells).nSize;
    Vec_PtrPush(&p_00->vCells,Entry);
    pcVar6 = Mio_GateReadName(pGate);
    pcVar6 = Abc_UtilStrsav(pcVar6);
    Entry->pName = pcVar6;
    dVar3 = Mio_GateReadArea(pGate);
    Entry->area = (float)dVar3;
    Entry->leakage = 0.0;
    Entry->drive_strength = 0;
    iVar4 = Mio_GateReadPinNum(pGate);
    Entry->n_inputs = iVar4;
    Entry->n_outputs = 1;
    uVar1 = Entry->area;
    uVar2 = Entry->leakage;
    Entry->areaI = (int)((float)uVar1 * 1000.0);
    Entry->leakageI = (int)((float)uVar2 * 1000.0);
    pMVar7 = Mio_GateReadPins(pGate);
    for (; pMVar7 != (Mio_Pin_t *)0x0; pMVar7 = Mio_PinReadNext(pMVar7)) {
      pSVar8 = Abc_SclPinAlloc();
      Vec_PtrPush(&Entry->vPins,pSVar8);
      pSVar8->dir = sc_dir_Input;
      pcVar6 = Mio_PinReadName(pMVar7);
      pcVar6 = Abc_UtilStrsav(pcVar6);
      pSVar8->pName = pcVar6;
      pSVar8->rise_cap = 0.0;
      pSVar8->fall_cap = 0.0;
      pSVar8->rise_capI = 0;
      pSVar8->fall_capI = 0;
    }
    for (iVar4 = 0; iVar4 < Entry->n_outputs; iVar4 = iVar4 + 1) {
      pwVar9 = Mio_GateReadTruthP(pGate);
      pSVar8 = Abc_SclPinAlloc();
      Vec_PtrPush(&Entry->vPins,pSVar8);
      pSVar8->dir = sc_dir_Output;
      pcVar6 = Mio_GateReadOutName(pGate);
      pcVar6 = Abc_UtilStrsav(pcVar6);
      pSVar8->pName = pcVar6;
      pSVar8->max_out_cap = 0.0;
      pSVar8->max_out_slew = 0.0;
      pcVar6 = Mio_GateReadForm(pGate);
      pcVar6 = Abc_UtilStrsav(pcVar6);
      pSVar8->func_text = pcVar6;
      p = &pSVar8->vFunc;
      nCapMin = 1 << ((char)Entry->n_inputs - 6U & 0x1f);
      if (Entry->n_inputs < 7) {
        nCapMin = 1;
      }
      Vec_WrdGrow(p,nCapMin);
      for (lVar10 = 0; lVar10 < p->nCap; lVar10 = lVar10 + 1) {
        Vec_WrdPush(p,pwVar9[lVar10]);
      }
      pMVar7 = Mio_GateReadPins(pGate);
      for (; pMVar7 != (Mio_Pin_t *)0x0; pMVar7 = Mio_PinReadNext(pMVar7)) {
        MVar5 = Mio_PinReadPhase(pMVar7);
        Entry_00 = Abc_SclTimingsAlloc();
        Vec_PtrPush(&pSVar8->vRTimings,Entry_00);
        pcVar6 = Mio_PinReadName(pMVar7);
        pcVar6 = Abc_UtilStrsav(pcVar6);
        Entry_00->pName = pcVar6;
        Entry_01 = Abc_SclTimingAlloc();
        Vec_PtrPush(&Entry_00->vTimings,Entry_01);
        if (MIO_PHASE_NONINV < MVar5) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLibScl.c"
                        ,0x9e,"int Abc_SclReadLibraryGenlib(SC_Lib *, Mio_Library_t *)");
        }
        Entry_01->tsense = sc_ts_Non - MVar5;
        Abc_SclReadSurfaceGenlib(&Entry_01->pCellRise);
        Abc_SclReadSurfaceGenlib(&Entry_01->pCellFall);
        Abc_SclReadSurfaceGenlib(&Entry_01->pRiseTrans);
        Abc_SclReadSurfaceGenlib(&Entry_01->pFallTrans);
      }
    }
    pGate = Mio_GateReadNext(pGate);
  } while( true );
}

Assistant:

SC_Lib * Abc_SclReadFromGenlib( void * pLib0 )
{
    Mio_Library_t * pLib = (Mio_Library_t *)pLib0;
    SC_Lib * p = Abc_SclLibAlloc();
    if ( !Abc_SclReadLibraryGenlib( p, pLib ) )
        return NULL;
    // hash gates by name
    Abc_SclHashCells( p );
    Abc_SclLinkCells( p );
    return p;
}